

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::initValueFromNonbasic(HModel *this,int firstvar,int lastvar)

{
  double dVar1;
  value_type vVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  int in_EDX;
  int in_ESI;
  HModel *in_RDI;
  int var;
  int local_14;
  
  for (local_14 = in_ESI; local_14 <= in_EDX; local_14 = local_14 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->nonbasicFlag,(long)local_14);
    if (*pvVar4 == 0) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->nonbasicMove,(long)local_14);
      *pvVar4 = 0;
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workLower,(long)local_14);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workUpper,(long)local_14);
      if ((dVar1 != *pvVar5) || (NAN(dVar1) || NAN(*pvVar5))) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->workLower,(long)local_14);
        bVar3 = hsol_isInfinity(in_RDI,-*pvVar5);
        if (bVar3) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->workUpper,(long)local_14);
          bVar3 = hsol_isInfinity(in_RDI,*pvVar5);
          if (bVar3) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->workValue,(long)local_14);
            *pvVar5 = 0.0;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->nonbasicMove,(long)local_14);
            *pvVar4 = 0;
          }
          else {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->workUpper,(long)local_14);
            vVar2 = *pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->workValue,(long)local_14);
            *pvVar5 = vVar2;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->nonbasicMove,(long)local_14);
            *pvVar4 = -1;
          }
        }
        else {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->workUpper,(long)local_14);
          bVar3 = hsol_isInfinity(in_RDI,*pvVar5);
          if (bVar3) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->workLower,(long)local_14);
            vVar2 = *pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->workValue,(long)local_14);
            *pvVar5 = vVar2;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->nonbasicMove,(long)local_14);
            *pvVar4 = 1;
          }
          else {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->nonbasicMove,(long)local_14);
            if (*pvVar4 == 1) {
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&in_RDI->workLower,(long)local_14);
              vVar2 = *pvVar5;
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&in_RDI->workValue,(long)local_14);
              *pvVar5 = vVar2;
            }
            else {
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&in_RDI->nonbasicMove,(long)local_14);
              if (*pvVar4 == -1) {
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&in_RDI->workUpper,(long)local_14);
                vVar2 = *pvVar5;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&in_RDI->workValue,(long)local_14);
                *pvVar5 = vVar2;
              }
              else {
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&in_RDI->nonbasicMove,(long)local_14);
                *pvVar4 = 1;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&in_RDI->workLower,(long)local_14);
                vVar2 = *pvVar5;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&in_RDI->workValue,(long)local_14);
                *pvVar5 = vVar2;
              }
            }
          }
        }
      }
      else {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->workLower,(long)local_14);
        vVar2 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->workValue,(long)local_14);
        *pvVar5 = vVar2;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->nonbasicMove,(long)local_14);
        *pvVar4 = 0;
      }
    }
  }
  return;
}

Assistant:

void HModel::initValueFromNonbasic(int firstvar, int lastvar) {
  // Initialise workValue and nonbasicMove from nonbasicFlag and
  // bounds, except for boxed variables when nonbasicMove is used to
  // set workValue=workLower/workUpper
  assert(firstvar >= 0);
  assert(lastvar < numTot);
  // double dl_pr_act, norm_dl_pr_act;
  //norm_dl_pr_act = 0.0;
  for (int var = firstvar; var <= lastvar; var++) {
    if (nonbasicFlag[var]) {
      // Nonbasic variable
      //double prev_pr_act = workValue[var];
      if (workLower[var] == workUpper[var]) {
	// Fixed
	workValue[var] = workLower[var];
	nonbasicMove[var] = NONBASIC_MOVE_ZE;
      } else if (!hsol_isInfinity(-workLower[var])) {
	// Finite lower bound so boxed or lower
	if (!hsol_isInfinity(workUpper[var])) {
	  // Finite upper bound so boxed
	  if (nonbasicMove[var] == NONBASIC_MOVE_UP) {
	    // Set at lower
	    workValue[var] = workLower[var];
	  } else if (nonbasicMove[var] == NONBASIC_MOVE_DN) {
	    // Set at upper
	    workValue[var] = workUpper[var];
	  } else {
	    // Invalid nonbasicMove: correct and set value at lower
	    nonbasicMove[var] = NONBASIC_MOVE_UP;
	    workValue[var] = workLower[var];
	  }	  
	} else {
	  // Lower
	  workValue[var] = workLower[var];
	  nonbasicMove[var] = NONBASIC_MOVE_UP;
	}
      } else if (!hsol_isInfinity(workUpper[var])) {
	// Upper
	workValue[var] = workUpper[var];
	nonbasicMove[var] = NONBASIC_MOVE_DN;
      } else {
	// FREE
	workValue[var] = 0;
	nonbasicMove[var] = NONBASIC_MOVE_ZE;
      }
      //dl_pr_act = workValue[var] - prev_pr_act;
      //norm_dl_pr_act += dl_pr_act*dl_pr_act;
      //      if (abs(dl_pr_act) > 1e-4) printf("Var %5d: [LB; Pr; UB] of [%8g; %8g; %8g] Du = %8g; DlPr = %8g\n",
      //					var, workLower[var], workValue[var], workUpper[var], workDual[var], dl_pr_act);
    } else {
      // Basic variable
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
    }
  }
  //  norm_dl_pr_act = sqrt(norm_dl_pr_act);
  //  printf("initValueFromNonbasic: ||Change in nonbasic variables||_2 is %g\n", norm_dl_pr_act);
}